

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O3

size_t Corrade::Utility::
       formatInto<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::String,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>,unsigned_long,char_const*>
                 (MutableStringView *buffer,char *format,BasicStringView<const_char> *args,
                 BasicStringView<const_char> *args_1,BasicStringView<const_char> *args_2,
                 String *args_3,BasicStringView<const_char> *args_4,
                 BasicStringView<const_char> *args_5,BasicStringView<const_char> *args_6,
                 unsigned_long *args_7,char **args_8)

{
  size_t sVar1;
  BufferFormatter local_118;
  undefined8 local_100;
  code *local_f8;
  BasicStringView<const_char> *local_f0;
  undefined8 local_e8;
  code *local_e0;
  BasicStringView<const_char> *local_d8;
  undefined8 local_d0;
  code *local_c8;
  String *local_c0;
  undefined8 local_b8;
  code *local_b0;
  BasicStringView<const_char> *local_a8;
  undefined8 local_a0;
  code *local_98;
  BasicStringView<const_char> *local_90;
  undefined8 local_88;
  code *local_80;
  BasicStringView<const_char> *local_78;
  undefined8 local_70;
  code *local_68;
  unsigned_long *local_60;
  undefined8 local_58;
  code *local_50;
  char **local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_118.size = 0xffffffffffffffff;
  local_118._fn =
       Implementation::BufferFormatter::
       BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
       ::
       {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
       ::FormatType_;
  local_100 = 0xffffffffffffffff;
  local_f8 = Implementation::BufferFormatter::
             BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
             ::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_e8 = 0xffffffffffffffff;
  local_e0 = Implementation::BufferFormatter::
             BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
             ::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_d0 = 0xffffffffffffffff;
  local_c8 = Implementation::BufferFormatter::
             BufferFormatter<Corrade::Containers::String>(Corrade::Containers::String_const&)::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_b8 = 0xffffffffffffffff;
  local_a8 = args_4;
  local_b0 = Implementation::BufferFormatter::
             BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
             ::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_a0 = 0xffffffffffffffff;
  local_90 = args_5;
  local_98 = Implementation::BufferFormatter::
             BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
             ::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_88 = 0xffffffffffffffff;
  local_78 = args_6;
  local_80 = Implementation::BufferFormatter::
             BufferFormatter<Corrade::Containers::BasicStringView<char_const>>(Corrade::Containers::BasicStringView<char_const>const&)
             ::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_70 = 0xffffffffffffffff;
  local_60 = args_7;
  local_68 = Implementation::BufferFormatter::BufferFormatter<unsigned_long>(unsigned_long_const&)::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_58 = 0xffffffffffffffff;
  local_48 = args_8;
  local_50 = Implementation::BufferFormatter::BufferFormatter<char_const*>(char_const*const&)::
             {lambda(Corrade::Containers::BasicStringView<char>const&,void_const*,int,Corrade::Utility::Implementation::FormatType)#1}
             ::FormatType_;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  local_118._value = args;
  local_f0 = args_1;
  local_d8 = args_2;
  local_c0 = args_3;
  sVar1 = Implementation::formatFormatters(buffer,format,&local_118,9);
  return sVar1;
}

Assistant:

std::size_t formatInto(const Containers::MutableStringView& buffer, const char* format, const Args&... args) {
    Implementation::BufferFormatter formatters[sizeof...(args) + 1] { Implementation::BufferFormatter{args}..., {} };
    return Implementation::formatFormatters(buffer, format, formatters, sizeof...(args));
}